

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStringCommand.cxx
# Opt level: O2

bool __thiscall
cmStringCommand::HandleStripCommand
          (cmStringCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  pointer pbVar1;
  pointer pcVar2;
  ulong uVar3;
  cmMakefile *this_00;
  int iVar4;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  allocator<char> local_69;
  long local_68;
  pointer local_60;
  cmStringCommand *local_58;
  string local_50;
  
  pbVar1 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  lVar6 = (long)(args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1;
  if (lVar6 == 0x60) {
    local_60 = pbVar1 + 1;
    pcVar2 = pbVar1[1]._M_dataplus._M_p;
    uVar3 = pbVar1[1]._M_string_length;
    uVar7 = uVar3 + 1;
    local_68 = lVar6;
    local_58 = this;
    for (uVar8 = 0; uVar3 != uVar8; uVar8 = uVar8 + 1) {
      iVar4 = isspace((int)pcVar2[uVar8]);
      uVar5 = uVar8;
      if (uVar7 <= uVar3) {
        uVar5 = uVar7;
      }
      if (iVar4 == 0) {
        uVar7 = uVar5;
      }
    }
    this_00 = (local_58->super_cmCommand).Makefile;
    std::__cxx11::string::substr((ulong)&local_50,(ulong)local_60);
    cmMakefile::AddDefinition(this_00,pbVar1 + 2,local_50._M_dataplus._M_p);
    std::__cxx11::string::~string((string *)&local_50);
    lVar6 = local_68;
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_50,"sub-command STRIP requires two arguments.",&local_69);
    cmCommand::SetError(&this->super_cmCommand,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
  }
  return lVar6 == 0x60;
}

Assistant:

bool cmStringCommand::HandleStripCommand(std::vector<std::string> const& args)
{
  if (args.size() != 3) {
    this->SetError("sub-command STRIP requires two arguments.");
    return false;
  }

  const std::string& stringValue = args[1];
  const std::string& variableName = args[2];
  size_t inStringLength = stringValue.size();
  size_t startPos = inStringLength + 1;
  size_t endPos = 0;
  const char* ptr = stringValue.c_str();
  size_t cc;
  for (cc = 0; cc < inStringLength; ++cc) {
    if (!isspace(*ptr)) {
      if (startPos > inStringLength) {
        startPos = cc;
      }
      endPos = cc;
    }
    ++ptr;
  }

  size_t outLength = 0;

  // if the input string didn't contain any non-space characters, return
  // an empty string
  if (startPos > inStringLength) {
    outLength = 0;
    startPos = 0;
  } else {
    outLength = endPos - startPos + 1;
  }

  this->Makefile->AddDefinition(
    variableName, stringValue.substr(startPos, outLength).c_str());
  return true;
}